

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::JunitReporter::testRunStarting(JunitReporter *this,TestRunInfo *runInfo)

{
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"testsuites",&local_31);
  XmlWriter::startElement(&this->xml,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

virtual void testRunStarting( TestRunInfo const& runInfo ) {
            CumulativeReporterBase::testRunStarting( runInfo );
            xml.startElement( "testsuites" );
        }